

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleScrollAdapter.cpp
# Opt level: O3

void __thiscall cursespp::SimpleScrollAdapter::AddEntry(SimpleScrollAdapter *this,string *value)

{
  SingleLineEntry *this_00;
  EntryPtr entry;
  SingleLineEntry *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  SingleLineEntry *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this_00 = (SingleLineEntry *)operator_new(0x38);
  SingleLineEntry::SingleLineEntry(this_00,value);
  local_28 = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<cursespp::SingleLineEntry*>
            (&local_20,this_00);
  local_38 = local_28;
  local_30 = local_20._M_pi;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
    }
  }
  (*(this->super_ScrollAdapterBase).super_IScrollAdapter._vptr_IScrollAdapter[9])(this,&local_38);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  return;
}

Assistant:

void SimpleScrollAdapter::AddEntry(const std::string& value) {
    EntryPtr entry(new SingleLineEntry(value));
    this->AddEntry(entry);
}